

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_mesh.cxx
# Opt level: O2

void __thiscall write_face::operator()(write_face *this,lw_face *face,xr_writer *w)

{
  undefined1 local_24 [4];
  
  (*w->_vptr_xr_writer[2])(w,local_24,4);
  (*w->_vptr_xr_writer[2])(w,local_24,4);
  (*w->_vptr_xr_writer[2])(w,local_24,4);
  (*w->_vptr_xr_writer[2])(w,local_24,4);
  (*w->_vptr_xr_writer[2])(w,local_24,4);
  (*w->_vptr_xr_writer[2])(w,local_24,4);
  return;
}

Assistant:

void operator()(const lw_face& face, xr_writer& w) const {
	w.w_u32(face.v0);
	w.w_u32(face.ref0);
	w.w_u32(face.v1);
	w.w_u32(face.ref1);
	w.w_u32(face.v2);
	w.w_u32(face.ref2);
}